

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceIntersectorK<4>_>,_false>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  AccelData *pAVar1;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  uint uVar21;
  undefined4 uVar22;
  undefined4 uVar25;
  ulong uVar23;
  ulong uVar24;
  ulong uVar26;
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar27;
  ulong uVar28;
  ulong uVar29;
  NodeRef nodeRef;
  Primitive *prim;
  size_t sVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar34;
  bool bVar35;
  uint uVar42;
  vint4 ai;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  vint4 ai_1;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 ai_3;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 bi;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  vint4 bi_1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vint4 bi_3;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  vint4 ai_2;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 bi_2;
  undefined1 auVar59 [16];
  float fVar60;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar61 [64];
  float fVar65;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar66 [64];
  undefined1 auVar70 [64];
  float fVar71;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar72 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  vbool<4> vVar80;
  Precalculations pre;
  undefined4 local_26d8;
  ulong local_26c0;
  vint4 bi_8;
  vbool<4> valid0;
  undefined1 local_2618 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 local_2608;
  undefined4 local_25f8;
  undefined4 uStack_25f4;
  undefined4 uStack_25f0;
  undefined4 uStack_25ec;
  undefined1 local_25e8 [16];
  float local_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float local_25c8;
  float fStack_25c4;
  float fStack_25c0;
  float fStack_25bc;
  float local_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  undefined1 local_25a8 [16];
  undefined1 local_2598 [16];
  undefined1 local_2588 [16];
  undefined1 local_2578 [16];
  InstanceIntersectorK<4> local_2568 [16];
  uint local_2558;
  uint uStack_2554;
  uint uStack_2550;
  uint uStack_254c;
  uint uStack_2548;
  uint uStack_2544;
  uint uStack_2540;
  uint uStack_253c;
  undefined4 local_2538;
  undefined4 uStack_2534;
  undefined4 uStack_2530;
  undefined4 uStack_252c;
  undefined4 uStack_2528;
  undefined4 uStack_2524;
  undefined4 uStack_2520;
  undefined4 uStack_251c;
  undefined4 local_2518;
  undefined4 uStack_2514;
  undefined4 uStack_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined4 uStack_2500;
  undefined4 uStack_24fc;
  uint local_24f8;
  uint uStack_24f4;
  uint uStack_24f0;
  uint uStack_24ec;
  uint uStack_24e8;
  uint uStack_24e4;
  uint uStack_24e0;
  uint uStack_24dc;
  undefined8 local_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 uStack_24c0;
  uint local_24b8;
  uint uStack_24b4;
  uint uStack_24b0;
  uint uStack_24ac;
  uint uStack_24a8;
  uint uStack_24a4;
  uint uStack_24a0;
  uint uStack_249c;
  undefined8 local_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 uStack_2480;
  uint local_2478;
  uint uStack_2474;
  uint uStack_2470;
  uint uStack_246c;
  uint uStack_2468;
  uint uStack_2464;
  uint uStack_2460;
  uint uStack_245c;
  float local_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float fStack_2440;
  float fStack_243c;
  uint local_2438;
  uint uStack_2434;
  uint uStack_2430;
  uint uStack_242c;
  uint uStack_2428;
  uint uStack_2424;
  uint uStack_2420;
  uint uStack_241c;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 uStack_2400;
  uint local_23f8;
  uint uStack_23f4;
  uint uStack_23f0;
  uint uStack_23ec;
  uint uStack_23e8;
  uint uStack_23e4;
  uint uStack_23e0;
  uint uStack_23dc;
  undefined8 local_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 uStack_23c0;
  undefined1 local_23b8 [32];
  float local_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  StackItemMaskT<embree::NodeRefPtr<8>_> stack [564];
  
  auVar4 = vpcmpeqd_avx(in_ZMM12._0_16_,in_ZMM12._0_16_);
  auVar76 = ZEXT1664(auVar4);
  auVar37 = vpcmpeqd_avx(auVar4,(undefined1  [16])valid_i->field_0);
  uVar21 = vmovmskps_avx(auVar37);
  if (uVar21 == 0) {
    return;
  }
  local_2608 = valid_i->field_0;
  pAVar1 = This->ptr;
  uVar26 = (ulong)(uVar21 & 0xff);
  auVar39 = *(undefined1 (*) [16])(ray + 0x40);
  auVar51._8_4_ = 0x7fffffff;
  auVar51._0_8_ = 0x7fffffff7fffffff;
  auVar51._12_4_ = 0x7fffffff;
  auVar49 = vandps_avx(auVar39,auVar51);
  auVar54._8_4_ = 0x219392ef;
  auVar54._0_8_ = 0x219392ef219392ef;
  auVar54._12_4_ = 0x219392ef;
  auVar49 = vcmpps_avx(auVar49,auVar54,1);
  auVar36 = vblendvps_avx(auVar39,auVar54,auVar49);
  auVar49 = *(undefined1 (*) [16])(ray + 0x50);
  auVar46 = vandps_avx(auVar49,auVar51);
  auVar46 = vcmpps_avx(auVar46,auVar54,1);
  auVar43 = vblendvps_avx(auVar49,auVar54,auVar46);
  auVar46 = *(undefined1 (*) [16])(ray + 0x60);
  auVar51 = vandps_avx(auVar46,auVar51);
  auVar51 = vcmpps_avx(auVar51,auVar54,1);
  auVar51 = vblendvps_avx(auVar46,auVar54,auVar51);
  auVar54 = vrcpps_avx(auVar36);
  auVar55._8_4_ = 0x3f800000;
  auVar55._0_8_ = 0x3f8000003f800000;
  auVar55._12_4_ = 0x3f800000;
  auVar36 = vfnmadd213ps_fma(auVar36,auVar54,auVar55);
  local_2588 = vfmadd132ps_fma(auVar36,auVar54,auVar54);
  auVar77 = ZEXT1664(local_2588);
  auVar36 = vrcpps_avx(auVar43);
  auVar43 = vfnmadd213ps_fma(auVar43,auVar36,auVar55);
  local_2598 = vfmadd132ps_fma(auVar43,auVar36,auVar36);
  auVar78 = ZEXT1664(local_2598);
  auVar36 = vrcpps_avx(auVar51);
  auVar51 = vfnmadd213ps_fma(auVar51,auVar36,auVar55);
  local_25a8 = vfmadd132ps_fma(auVar51,auVar36,auVar36);
  auVar79 = ZEXT1664(local_25a8);
  auVar54 = ZEXT816(0);
  auVar51 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar54);
  local_25e8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar54);
  auVar70 = ZEXT1664(auVar4 ^ auVar37);
  auVar36._8_4_ = 1;
  auVar36._0_8_ = 0x100000001;
  auVar36._12_4_ = 1;
  auVar39 = vcmpps_avx(auVar39,auVar54,1);
  auVar39 = vandps_avx(auVar39,auVar36);
  auVar43._8_4_ = 2;
  auVar43._0_8_ = 0x200000002;
  auVar43._12_4_ = 2;
  auVar49 = vcmpps_avx(auVar49,auVar54,1);
  auVar49 = vandps_avx(auVar49,auVar43);
  auVar49 = vorps_avx(auVar49,auVar39);
  auVar39 = vcmpps_avx(auVar46,auVar54,1);
  auVar46._8_4_ = 4;
  auVar46._0_8_ = 0x400000004;
  auVar46._12_4_ = 4;
  auVar39 = vandps_avx(auVar39,auVar46);
  auVar4 = vpor_avx(auVar4 ^ auVar37,auVar39);
  local_2618 = vpor_avx(auVar4,auVar49);
  local_25b8 = *(float *)ray;
  fStack_25b4 = *(float *)(ray + 4);
  fStack_25b0 = *(float *)(ray + 8);
  fStack_25ac = *(float *)(ray + 0xc);
  fVar71 = local_2588._0_4_ * -*(float *)ray;
  fVar73 = local_2588._4_4_ * -*(float *)(ray + 4);
  fVar74 = local_2588._8_4_ * -*(float *)(ray + 8);
  fVar75 = local_2588._12_4_ * -*(float *)(ray + 0xc);
  local_25c8 = *(float *)(ray + 0x10);
  fStack_25c4 = *(float *)(ray + 0x14);
  fStack_25c0 = *(float *)(ray + 0x18);
  fStack_25bc = *(float *)(ray + 0x1c);
  fVar60 = local_2598._0_4_ * -*(float *)(ray + 0x10);
  fVar62 = local_2598._4_4_ * -*(float *)(ray + 0x14);
  fVar63 = local_2598._8_4_ * -*(float *)(ray + 0x18);
  fVar64 = local_2598._12_4_ * -*(float *)(ray + 0x1c);
  local_25d8 = *(float *)(ray + 0x20);
  fStack_25d4 = *(float *)(ray + 0x24);
  fStack_25d0 = *(float *)(ray + 0x28);
  fStack_25cc = *(float *)(ray + 0x2c);
  fVar65 = local_25a8._0_4_ * -*(float *)(ray + 0x20);
  fVar67 = local_25a8._4_4_ * -*(float *)(ray + 0x24);
  fVar68 = local_25a8._8_4_ * -*(float *)(ray + 0x28);
  fVar69 = local_25a8._12_4_ * -*(float *)(ray + 0x2c);
  local_2558 = 0x80000000;
  uStack_2554 = 0x80000000;
  uStack_2550 = 0x80000000;
  uStack_254c = 0x80000000;
  uStack_2548 = 0x80000000;
  uStack_2544 = 0x80000000;
  uStack_2540 = 0x80000000;
  uStack_253c = 0x80000000;
  local_25f8 = 0x7f800000;
  uStack_25f4 = 0x7f800000;
  uStack_25f0 = 0x7f800000;
  uStack_25ec = 0x7f800000;
LAB_005f44d4:
  lVar9 = 0;
  for (uVar23 = uVar26; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
    lVar9 = lVar9 + 1;
  }
  uVar22 = *(undefined4 *)(local_2618 + lVar9 * 4);
  auVar37._4_4_ = uVar22;
  auVar37._0_4_ = uVar22;
  auVar37._8_4_ = uVar22;
  auVar37._12_4_ = uVar22;
  auVar38 = vpcmpeqd_avx(auVar37,local_2618);
  uVar25 = (undefined4)((ulong)lVar9 >> 0x20);
  uVar22 = vmovmskps_avx(auVar38);
  stack[0].mask = CONCAT44(uVar25,uVar22);
  auVar5._4_4_ = fStack_25b4;
  auVar5._0_4_ = local_25b8;
  auVar5._8_4_ = fStack_25b0;
  auVar5._12_4_ = fStack_25ac;
  auVar59._8_4_ = 0x7f800000;
  auVar59._0_8_ = 0x7f8000007f800000;
  auVar59._12_4_ = 0x7f800000;
  auVar4 = vblendvps_avx(auVar59,auVar5,auVar38);
  uVar26 = ~stack[0].mask & uVar26;
  auVar37 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vminps_avx(auVar37,auVar4);
  auVar37 = vshufpd_avx(auVar4,auVar4,1);
  auVar37 = vminps_avx(auVar37,auVar4);
  auVar49._4_4_ = fStack_25c4;
  auVar49._0_4_ = local_25c8;
  auVar49._8_4_ = fStack_25c0;
  auVar49._12_4_ = fStack_25bc;
  auVar4 = vblendvps_avx(auVar59,auVar49,auVar38);
  auVar39 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vminps_avx(auVar39,auVar4);
  auVar39 = vshufpd_avx(auVar4,auVar4,1);
  auVar4 = vminps_avx(auVar39,auVar4);
  auVar37 = vinsertps_avx(auVar37,auVar4,0x1c);
  auVar3._4_4_ = fStack_25d4;
  auVar3._0_4_ = local_25d8;
  auVar3._8_4_ = fStack_25d0;
  auVar3._12_4_ = fStack_25cc;
  auVar4 = vblendvps_avx(auVar59,auVar3,auVar38);
  auVar39 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vminps_avx(auVar39,auVar4);
  auVar39 = vshufpd_avx(auVar4,auVar4,1);
  auVar39 = vminps_avx(auVar39,auVar4);
  auVar57._8_4_ = 0xff800000;
  auVar57._0_8_ = 0xff800000ff800000;
  auVar57._12_4_ = 0xff800000;
  auVar4 = vblendvps_avx(auVar57,auVar5,auVar38);
  auVar39 = vinsertps_avx(auVar37,auVar39,0x20);
  auVar37 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vmaxps_avx(auVar37,auVar4);
  auVar37 = vshufpd_avx(auVar4,auVar4,1);
  auVar37 = vmaxps_avx(auVar37,auVar4);
  auVar4 = vblendvps_avx(auVar57,auVar49,auVar38);
  auVar49 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vmaxps_avx(auVar49,auVar4);
  auVar49 = vshufpd_avx(auVar4,auVar4,1);
  auVar4 = vmaxps_avx(auVar49,auVar4);
  auVar37 = vinsertps_avx(auVar37,auVar4,0x1c);
  auVar4 = vblendvps_avx(auVar57,auVar3,auVar38);
  auVar49 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vmaxps_avx(auVar49,auVar4);
  auVar49 = vshufpd_avx(auVar4,auVar4,1);
  auVar49 = vmaxps_avx(auVar49,auVar4);
  auVar4 = vblendvps_avx(auVar59,auVar77._0_16_,auVar38);
  auVar46 = vinsertps_avx(auVar37,auVar49,0x20);
  auVar37 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vminps_avx(auVar37,auVar4);
  auVar37 = vshufpd_avx(auVar4,auVar4,1);
  auVar37 = vminps_avx(auVar37,auVar4);
  auVar4 = vblendvps_avx(auVar59,auVar78._0_16_,auVar38);
  auVar49 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vminps_avx(auVar49,auVar4);
  auVar49 = vshufpd_avx(auVar4,auVar4,1);
  auVar4 = vminps_avx(auVar49,auVar4);
  auVar37 = vinsertps_avx(auVar37,auVar4,0x1c);
  auVar4 = vblendvps_avx(auVar59,auVar79._0_16_,auVar38);
  auVar49 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vminps_avx(auVar49,auVar4);
  auVar49 = vshufpd_avx(auVar4,auVar4,1);
  auVar49 = vminps_avx(auVar49,auVar4);
  auVar4 = vblendvps_avx(auVar57,auVar77._0_16_,auVar38);
  auVar36 = vinsertps_avx(auVar37,auVar49,0x20);
  auVar37 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vmaxps_avx(auVar37,auVar4);
  auVar37 = vshufpd_avx(auVar4,auVar4,1);
  auVar37 = vmaxps_avx(auVar37,auVar4);
  auVar4 = vblendvps_avx(auVar57,auVar78._0_16_,auVar38);
  auVar49 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vmaxps_avx(auVar49,auVar4);
  auVar49 = vshufpd_avx(auVar4,auVar4,1);
  auVar4 = vmaxps_avx(auVar49,auVar4);
  auVar37 = vinsertps_avx(auVar37,auVar4,0x1c);
  auVar4 = vblendvps_avx(auVar57,auVar79._0_16_,auVar38);
  auVar49 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vmaxps_avx(auVar49,auVar4);
  auVar49 = vshufpd_avx(auVar4,auVar4,1);
  auVar49 = vmaxps_avx(auVar49,auVar4);
  auVar4 = vblendvps_avx(auVar59,auVar51,auVar38);
  auVar43 = vinsertps_avx(auVar37,auVar49,0x20);
  auVar37 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar55 = vminps_avx(auVar37,auVar4);
  auVar5 = vshufpd_avx(auVar55,auVar55,1);
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 vblendvps_avx(auVar57,local_25e8,auVar38);
  auVar54 = vshufps_avx((undefined1  [16])bi_8.field_0,(undefined1  [16])bi_8.field_0,0xb1);
  auVar49 = vcmpps_avx(auVar36,_DAT_01f7aa10,5);
  auVar4 = vblendvps_avx(auVar43,auVar36,auVar49);
  auVar37 = vblendvps_avx(auVar39,auVar46,auVar49);
  auVar57 = auVar70._0_16_;
  auVar54 = vmaxps_avx(auVar54,(undefined1  [16])bi_8.field_0);
  auVar39 = vblendvps_avx(auVar46,auVar39,auVar49);
  local_2398 = auVar4._0_4_;
  auVar3 = vmovshdup_avx(auVar4);
  uVar29 = (ulong)(auVar3._0_4_ < 0.0) << 5 | 0x40;
  auVar46 = vshufpd_avx(auVar4,auVar4,1);
  auVar52 = vshufpd_avx(auVar54,auVar54,1);
  uVar33 = (ulong)(auVar46._0_4_ < 0.0) << 5 | 0x80;
  auVar55 = vminps_avx(auVar5,auVar55);
  auVar46 = vmaxps_avx(auVar52,auVar54);
  auVar72 = ZEXT1664(CONCAT412(fVar75,CONCAT48(fVar74,CONCAT44(fVar73,fVar71))));
  auVar70 = ZEXT1664(auVar57);
  auVar49 = vblendvps_avx(auVar36,auVar43,auVar49);
  auVar58._0_4_ = auVar37._0_4_ * local_2398;
  auVar58._4_4_ = auVar37._4_4_ * auVar4._4_4_;
  auVar58._8_4_ = auVar37._8_4_ * auVar4._8_4_;
  auVar58._12_4_ = auVar37._12_4_ * auVar4._12_4_;
  auVar61 = ZEXT1664(CONCAT412(fVar64,CONCAT48(fVar63,CONCAT44(fVar62,fVar60))));
  local_2458 = auVar49._0_4_;
  auVar52._0_4_ = auVar39._0_4_ * local_2458;
  auVar52._4_4_ = auVar39._4_4_ * auVar49._4_4_;
  auVar52._8_4_ = auVar39._8_4_ * auVar49._8_4_;
  auVar52._12_4_ = auVar39._12_4_ * auVar49._12_4_;
  auVar66 = ZEXT1664(CONCAT412(fVar69,CONCAT48(fVar68,CONCAT44(fVar67,fVar65))));
  uVar32 = (ulong)(local_2398 < 0.0) * 0x20;
  stack[0].ptr.ptr = *(size_t *)&pAVar1[1].bounds.bounds0.lower.field_0;
  fStack_2394 = local_2398;
  fStack_2390 = local_2398;
  fStack_238c = local_2398;
  fStack_2388 = local_2398;
  fStack_2384 = local_2398;
  fStack_2380 = local_2398;
  fStack_237c = local_2398;
  local_23b8._0_4_ = (uint)auVar58._0_4_ ^ local_2558;
  local_23b8._4_4_ = (uint)auVar58._0_4_ ^ uStack_2554;
  local_23b8._8_4_ = (uint)auVar58._0_4_ ^ uStack_2550;
  local_23b8._12_4_ = (uint)auVar58._0_4_ ^ uStack_254c;
  local_23b8._16_4_ = (uint)auVar58._0_4_ ^ uStack_2548;
  local_23b8._20_4_ = (uint)auVar58._0_4_ ^ uStack_2544;
  local_23b8._24_4_ = (uint)auVar58._0_4_ ^ uStack_2540;
  local_23b8._28_4_ = (uint)auVar58._0_4_ ^ uStack_253c;
  local_23d8 = auVar3._0_8_;
  uStack_23d0 = local_23d8;
  uStack_23c8 = local_23d8;
  uStack_23c0 = local_23d8;
  auVar37 = vmovshdup_avx(auVar58);
  uVar21 = auVar37._0_4_;
  uVar42 = auVar37._4_4_;
  local_23f8 = uVar21 ^ local_2558;
  uStack_23f4 = uVar42 ^ uStack_2554;
  uStack_23f0 = uVar21 ^ uStack_2550;
  uStack_23ec = uVar42 ^ uStack_254c;
  uStack_23e8 = uVar21 ^ uStack_2548;
  uStack_23e4 = uVar42 ^ uStack_2544;
  uStack_23e0 = uVar21 ^ uStack_2540;
  uStack_23dc = uVar42 ^ uStack_253c;
  auVar4 = vshufps_avx(auVar4,auVar4,0xaa);
  local_2418 = auVar4._0_8_;
  uStack_2410 = local_2418;
  uStack_2408 = local_2418;
  uStack_2400 = local_2418;
  auVar4 = vshufps_avx(auVar58,auVar58,0xaa);
  uVar21 = auVar4._0_4_;
  uVar42 = auVar4._4_4_;
  local_2438 = uVar21 ^ local_2558;
  uStack_2434 = uVar42 ^ uStack_2554;
  uStack_2430 = uVar21 ^ uStack_2550;
  uStack_242c = uVar42 ^ uStack_254c;
  uStack_2428 = uVar21 ^ uStack_2548;
  uStack_2424 = uVar42 ^ uStack_2544;
  uStack_2420 = uVar21 ^ uStack_2540;
  uStack_241c = uVar42 ^ uStack_253c;
  fStack_2454 = local_2458;
  fStack_2450 = local_2458;
  fStack_244c = local_2458;
  fStack_2448 = local_2458;
  fStack_2444 = local_2458;
  fStack_2440 = local_2458;
  fStack_243c = local_2458;
  local_2478 = (uint)auVar52._0_4_ ^ local_2558;
  uStack_2474 = (uint)auVar52._0_4_ ^ uStack_2554;
  uStack_2470 = (uint)auVar52._0_4_ ^ uStack_2550;
  uStack_246c = (uint)auVar52._0_4_ ^ uStack_254c;
  uStack_2468 = (uint)auVar52._0_4_ ^ uStack_2548;
  uStack_2464 = (uint)auVar52._0_4_ ^ uStack_2544;
  uStack_2460 = (uint)auVar52._0_4_ ^ uStack_2540;
  uStack_245c = (uint)auVar52._0_4_ ^ uStack_253c;
  auVar4 = vmovshdup_avx(auVar49);
  local_2498 = auVar4._0_8_;
  uStack_2490 = local_2498;
  uStack_2488 = local_2498;
  uStack_2480 = local_2498;
  auVar4 = vmovshdup_avx(auVar52);
  uVar21 = auVar4._0_4_;
  uVar42 = auVar4._4_4_;
  local_24b8 = uVar21 ^ local_2558;
  uStack_24b4 = uVar42 ^ uStack_2554;
  uStack_24b0 = uVar21 ^ uStack_2550;
  uStack_24ac = uVar42 ^ uStack_254c;
  uStack_24a8 = uVar21 ^ uStack_2548;
  uStack_24a4 = uVar42 ^ uStack_2544;
  uStack_24a0 = uVar21 ^ uStack_2540;
  uStack_249c = uVar42 ^ uStack_253c;
  auVar4 = vshufps_avx(auVar49,auVar49,0xaa);
  auVar50 = ZEXT1664(auVar38);
  local_24d8 = auVar4._0_8_;
  uStack_24d0 = local_24d8;
  uStack_24c8 = local_24d8;
  uStack_24c0 = local_24d8;
  auVar4 = vshufps_avx(auVar52,auVar52,0xaa);
  uVar21 = auVar4._0_4_;
  uVar42 = auVar4._4_4_;
  local_24f8 = uVar21 ^ local_2558;
  uStack_24f4 = uVar42 ^ uStack_2554;
  uStack_24f0 = uVar21 ^ uStack_2550;
  uStack_24ec = uVar42 ^ uStack_254c;
  uStack_24e8 = uVar21 ^ uStack_2548;
  uStack_24e4 = uVar42 ^ uStack_2544;
  uStack_24e0 = uVar21 ^ uStack_2540;
  uStack_24dc = uVar42 ^ uStack_253c;
  local_26d8 = auVar55._0_4_;
  local_2518 = local_26d8;
  uStack_2514 = local_26d8;
  uStack_2510 = local_26d8;
  uStack_250c = local_26d8;
  uStack_2508 = local_26d8;
  uStack_2504 = local_26d8;
  uStack_2500 = local_26d8;
  uStack_24fc = local_26d8;
  local_2538 = auVar46._0_4_;
  uStack_2534 = local_2538;
  uStack_2530 = local_2538;
  uStack_252c = local_2538;
  uStack_2528 = local_2538;
  uStack_2524 = local_2538;
  uStack_2520 = local_2538;
  uStack_251c = local_2538;
  uVar22 = vmovmskps_avx(auVar57);
  uVar23 = CONCAT44(uVar25,uVar22);
  auVar4._4_4_ = uStack_25f4;
  auVar4._0_4_ = local_25f8;
  auVar4._8_4_ = uStack_25f0;
  auVar4._12_4_ = uStack_25ec;
  auVar4 = vblendvps_avx(auVar4,auVar51,auVar38);
  auVar41 = ZEXT1664(auVar4);
  pSVar27 = stack + 1;
LAB_005f48d2:
  auVar39 = auVar70._0_16_;
  uVar23 = ~uVar23;
  auVar37 = auVar50._0_16_;
  while( true ) {
    pSVar34 = pSVar27 + -1;
    if ((pSVar27[-1].mask & uVar23) == 0) break;
    uVar28 = (pSVar34->ptr).ptr;
    uVar24 = uVar28;
    auVar49 = auVar50._0_16_;
    if ((uVar28 & 8) != 0) {
LAB_005f4b09:
      uVar24 = (ulong)((uint)uVar28 & 0xf) - 8;
      uVar23 = uVar24;
      local_2578 = auVar39;
      if (uVar24 == 0) goto LAB_005f4c04;
      prim = (Primitive *)(uVar28 & 0xfffffffffffffff0);
      local_26c0 = 1;
      valid0.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar39 ^ auVar76._0_16_);
      goto LAB_005f4b44;
    }
    while( true ) {
      auVar20._4_4_ = fStack_2394;
      auVar20._0_4_ = local_2398;
      auVar20._8_4_ = fStack_2390;
      auVar20._12_4_ = fStack_238c;
      auVar20._16_4_ = fStack_2388;
      auVar20._20_4_ = fStack_2384;
      auVar20._24_4_ = fStack_2380;
      auVar20._28_4_ = fStack_237c;
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar32),local_23b8,auVar20);
      auVar6._4_4_ = uStack_23f4;
      auVar6._0_4_ = local_23f8;
      auVar6._8_4_ = uStack_23f0;
      auVar6._12_4_ = uStack_23ec;
      auVar6._16_4_ = uStack_23e8;
      auVar6._20_4_ = uStack_23e4;
      auVar6._24_4_ = uStack_23e0;
      auVar6._28_4_ = uStack_23dc;
      auVar19._8_8_ = uStack_23d0;
      auVar19._0_8_ = local_23d8;
      auVar19._16_8_ = uStack_23c8;
      auVar19._24_8_ = uStack_23c0;
      auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar29),auVar6,auVar19);
      auVar6 = vpmaxsd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar46));
      auVar17._4_4_ = uStack_2434;
      auVar17._0_4_ = local_2438;
      auVar17._8_4_ = uStack_2430;
      auVar17._12_4_ = uStack_242c;
      auVar17._16_4_ = uStack_2428;
      auVar17._20_4_ = uStack_2424;
      auVar17._24_4_ = uStack_2420;
      auVar17._28_4_ = uStack_241c;
      auVar18._8_8_ = uStack_2410;
      auVar18._0_8_ = local_2418;
      auVar18._16_8_ = uStack_2408;
      auVar18._24_8_ = uStack_2400;
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar33),auVar17,auVar18);
      auVar7._4_4_ = uStack_2514;
      auVar7._0_4_ = local_2518;
      auVar7._8_4_ = uStack_2510;
      auVar7._12_4_ = uStack_250c;
      auVar7._16_4_ = uStack_2508;
      auVar7._20_4_ = uStack_2504;
      auVar7._24_4_ = uStack_2500;
      auVar7._28_4_ = uStack_24fc;
      auVar7 = vpmaxsd_avx2(ZEXT1632(auVar49),auVar7);
      auVar6 = vpmaxsd_avx2(auVar6,auVar7);
      auVar15._4_4_ = uStack_2474;
      auVar15._0_4_ = local_2478;
      auVar15._8_4_ = uStack_2470;
      auVar15._12_4_ = uStack_246c;
      auVar15._16_4_ = uStack_2468;
      auVar15._20_4_ = uStack_2464;
      auVar15._24_4_ = uStack_2460;
      auVar15._28_4_ = uStack_245c;
      auVar16._4_4_ = fStack_2454;
      auVar16._0_4_ = local_2458;
      auVar16._8_4_ = fStack_2450;
      auVar16._12_4_ = fStack_244c;
      auVar16._16_4_ = fStack_2448;
      auVar16._20_4_ = fStack_2444;
      auVar16._24_4_ = fStack_2440;
      auVar16._28_4_ = fStack_243c;
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar32 ^ 0x20)),auVar15,
                                auVar16);
      auVar13._4_4_ = uStack_24b4;
      auVar13._0_4_ = local_24b8;
      auVar13._8_4_ = uStack_24b0;
      auVar13._12_4_ = uStack_24ac;
      auVar13._16_4_ = uStack_24a8;
      auVar13._20_4_ = uStack_24a4;
      auVar13._24_4_ = uStack_24a0;
      auVar13._28_4_ = uStack_249c;
      auVar14._8_8_ = uStack_2490;
      auVar14._0_8_ = local_2498;
      auVar14._16_8_ = uStack_2488;
      auVar14._24_8_ = uStack_2480;
      auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar29 ^ 0x20)),auVar13,
                                auVar14);
      auVar7 = vpminsd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar46));
      auVar11._4_4_ = uStack_24f4;
      auVar11._0_4_ = local_24f8;
      auVar11._8_4_ = uStack_24f0;
      auVar11._12_4_ = uStack_24ec;
      auVar11._16_4_ = uStack_24e8;
      auVar11._20_4_ = uStack_24e4;
      auVar11._24_4_ = uStack_24e0;
      auVar11._28_4_ = uStack_24dc;
      auVar12._8_8_ = uStack_24d0;
      auVar12._0_8_ = local_24d8;
      auVar12._16_8_ = uStack_24c8;
      auVar12._24_8_ = uStack_24c0;
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar33 ^ 0x20)),auVar11,
                                auVar12);
      auVar8._4_4_ = uStack_2534;
      auVar8._0_4_ = local_2538;
      auVar8._8_4_ = uStack_2530;
      auVar8._12_4_ = uStack_252c;
      auVar8._16_4_ = uStack_2528;
      auVar8._20_4_ = uStack_2524;
      auVar8._24_4_ = uStack_2520;
      auVar8._28_4_ = uStack_251c;
      auVar8 = vpminsd_avx2(ZEXT1632(auVar49),auVar8);
      auVar7 = vpminsd_avx2(auVar7,auVar8);
      auVar6 = vcmpps_avx(auVar6,auVar7,2);
      auVar41 = ZEXT3264(auVar6);
      uVar21 = vmovmskps_avx(auVar6);
      pSVar27 = pSVar34;
      if (uVar21 == 0) break;
      uVar31 = (ulong)(uVar21 & 0xff);
      sVar30 = 0;
      uVar28 = 8;
      do {
        lVar9 = 0;
        for (uVar10 = uVar31; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
          lVar9 = lVar9 + 1;
        }
        uVar22 = *(undefined4 *)(uVar24 + 0x40 + lVar9 * 4);
        auVar38._4_4_ = uVar22;
        auVar38._0_4_ = uVar22;
        auVar38._8_4_ = uVar22;
        auVar38._12_4_ = uVar22;
        auVar36 = vfmadd213ps_fma(auVar38,auVar77._0_16_,auVar72._0_16_);
        uVar22 = *(undefined4 *)(uVar24 + 0x80 + lVar9 * 4);
        auVar44._4_4_ = uVar22;
        auVar44._0_4_ = uVar22;
        auVar44._8_4_ = uVar22;
        auVar44._12_4_ = uVar22;
        auVar43 = vfmadd213ps_fma(auVar44,auVar78._0_16_,auVar61._0_16_);
        uVar22 = *(undefined4 *)(uVar24 + 0xc0 + lVar9 * 4);
        auVar47._4_4_ = uVar22;
        auVar47._0_4_ = uVar22;
        auVar47._8_4_ = uVar22;
        auVar47._12_4_ = uVar22;
        auVar54 = vfmadd213ps_fma(auVar47,auVar79._0_16_,auVar66._0_16_);
        uVar22 = *(undefined4 *)(uVar24 + 0x60 + lVar9 * 4);
        auVar48._4_4_ = uVar22;
        auVar48._0_4_ = uVar22;
        auVar48._8_4_ = uVar22;
        auVar48._12_4_ = uVar22;
        auVar55 = vfmadd213ps_fma(auVar48,auVar77._0_16_,auVar72._0_16_);
        uVar22 = *(undefined4 *)(uVar24 + 0xa0 + lVar9 * 4);
        auVar53._4_4_ = uVar22;
        auVar53._0_4_ = uVar22;
        auVar53._8_4_ = uVar22;
        auVar53._12_4_ = uVar22;
        auVar3 = vfmadd213ps_fma(auVar53,auVar78._0_16_,auVar61._0_16_);
        uVar22 = *(undefined4 *)(uVar24 + 0xe0 + lVar9 * 4);
        auVar56._4_4_ = uVar22;
        auVar56._0_4_ = uVar22;
        auVar56._8_4_ = uVar22;
        auVar56._12_4_ = uVar22;
        auVar38 = vfmadd213ps_fma(auVar56,auVar79._0_16_,auVar66._0_16_);
        auVar49 = vpminsd_avx(auVar36,auVar55);
        auVar46 = vpminsd_avx(auVar43,auVar3);
        auVar49 = vpmaxsd_avx(auVar49,auVar46);
        auVar46 = vpminsd_avx(auVar54,auVar38);
        auVar46 = vpmaxsd_avx(auVar46,auVar4);
        auVar49 = vpmaxsd_avx(auVar49,auVar46);
        auVar46 = vpmaxsd_avx(auVar36,auVar55);
        auVar36 = vpmaxsd_avx(auVar43,auVar3);
        auVar36 = vpminsd_avx(auVar46,auVar36);
        auVar46 = vpmaxsd_avx(auVar54,auVar38);
        auVar46 = vpminsd_avx(auVar46,(undefined1  [16])bi_8.field_0);
        auVar46 = vpminsd_avx(auVar36,auVar46);
        auVar49 = vcmpps_avx(auVar49,auVar46,2);
        auVar41 = ZEXT1664(auVar49);
        uVar21 = vmovmskps_avx(auVar49);
        if (uVar21 != 0) {
          uVar10 = *(ulong *)(uVar24 + lVar9 * 8);
          if (uVar28 != 8) {
            (pSVar34->ptr).ptr = uVar28;
            pSVar34->mask = sVar30;
            pSVar34 = pSVar34 + 1;
          }
          sVar30 = (size_t)(uVar21 & 0xff);
          uVar28 = uVar10;
        }
        auVar50 = ZEXT1664(auVar37);
        uVar31 = uVar31 - 1 & uVar31;
      } while (uVar31 != 0);
      pSVar27 = pSVar34;
      if (uVar28 == 8) break;
      uVar24 = uVar28;
      if ((uVar28 & 8) != 0) {
        auVar49 = auVar37;
        if (sVar30 == 0) goto LAB_005f4c2e;
        goto LAB_005f4b09;
      }
    }
    auVar46 = auVar41._0_16_;
    if (pSVar27 == stack) goto LAB_005f4c3c;
  }
  goto LAB_005f4c2e;
  while( true ) {
    prim = prim + 1;
    uVar23 = local_26c0 + 1;
    bVar35 = uVar24 <= local_26c0;
    local_26c0 = uVar23;
    valid0.field_0 = aVar2;
    if (bVar35) break;
LAB_005f4b44:
    auVar76 = ZEXT1664(auVar76._0_16_);
    vVar80 = InstanceIntersectorK<4>::occluded(local_2568,&valid0,&pre,ray,context,prim);
    uVar23 = vVar80.field_0._0_8_;
    aVar2.v = (__m128)vandnps_avx((undefined1  [16])local_2568,valid0.field_0);
    auVar39 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_2568;
    if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar39[0xf])
    break;
  }
  auVar49 = vpcmpeqd_avx(auVar76._0_16_,auVar76._0_16_);
  auVar76 = ZEXT1664(auVar49);
  auVar39._0_4_ = auVar49._0_4_ ^ aVar2.i[0];
  auVar39._4_4_ = auVar49._4_4_ ^ aVar2.i[1];
  auVar39._8_4_ = auVar49._8_4_ ^ aVar2.i[2];
  auVar39._12_4_ = auVar49._12_4_ ^ aVar2.i[3];
  auVar77 = ZEXT1664(local_2588);
  auVar78 = ZEXT1664(local_2598);
  auVar79 = ZEXT1664(local_25a8);
  auVar72 = ZEXT1664(CONCAT412(fVar75,CONCAT48(fVar74,CONCAT44(fVar73,fVar71))));
  auVar61 = ZEXT1664(CONCAT412(fVar64,CONCAT48(fVar63,CONCAT44(fVar62,fVar60))));
  auVar66 = ZEXT1664(CONCAT412(fVar69,CONCAT48(fVar68,CONCAT44(fVar67,fVar65))));
  auVar49 = auVar37;
LAB_005f4c04:
  auVar37 = vorps_avx(local_2578,auVar39);
  auVar70 = ZEXT1664(auVar37);
  auVar36 = auVar49 & ~auVar37;
  auVar46 = auVar39;
  if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar36 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar36[0xf])
  goto LAB_005f4c3c;
  auVar39 = vandnps_avx(auVar37,auVar49);
  auVar50 = ZEXT1664(auVar39);
  auVar40._8_4_ = 0xff800000;
  auVar40._0_8_ = 0xff800000ff800000;
  auVar40._12_4_ = 0xff800000;
  auVar41 = ZEXT1664(auVar40);
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 vblendvps_avx((undefined1  [16])bi_8.field_0,auVar40,auVar37);
LAB_005f4c2e:
  auVar46 = auVar41._0_16_;
  uVar22 = vmovmskps_avx(auVar70._0_16_);
  uVar23 = CONCAT44((int)(uVar23 >> 0x20),uVar22);
  pSVar27 = pSVar34;
  if (pSVar34 == stack) goto LAB_005f4c3c;
  goto LAB_005f48d2;
LAB_005f4c3c:
  if (uVar26 == 0) {
    auVar4 = vpcmpeqd_avx(auVar46,auVar46);
    auVar4 = vpcmpeqd_avx(auVar4,(undefined1  [16])local_2608);
    auVar4 = vpand_avx(auVar70._0_16_,auVar4);
    auVar45._8_4_ = 0xff800000;
    auVar45._0_8_ = 0xff800000ff800000;
    auVar45._12_4_ = 0xff800000;
    auVar4 = vmaskmovps_avx(auVar4,auVar45);
    *(undefined1 (*) [16])(ray + 0x80) = auVar4;
    return;
  }
  goto LAB_005f44d4;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }